

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_linux-inl.h
# Opt level: O0

void base::internal::SpinLockDelay(atomic<int> *w,int32_t value,int loop)

{
  int iVar1;
  int *piVar2;
  undefined1 local_30 [8];
  timespec tm;
  int save_errno;
  int loop_local;
  int32_t value_local;
  atomic<int> *w_local;
  
  if (loop != 0) {
    piVar2 = __errno_location();
    tm.tv_nsec._4_4_ = *piVar2;
    local_30 = (undefined1  [8])0x0;
    if ((have_futex & 1U) == 0) {
      tm.tv_sec = 0x1e8481;
    }
    else {
      iVar1 = SuggestedDelayNS(loop);
      tm.tv_sec = (__time_t)iVar1;
    }
    if ((have_futex & 1U) == 0) {
      nanosleep((timespec *)local_30,(timespec *)0x0);
    }
    else {
      tm.tv_sec = tm.tv_sec << 4;
      syscall(0xca,w,(ulong)(uint)futex_private_flag,(ulong)(uint)value,local_30,0,0);
    }
    iVar1 = tm.tv_nsec._4_4_;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

void SpinLockDelay(std::atomic<int> *w, int32_t value, int loop) {
  if (loop != 0) {
    int save_errno = errno;
    struct timespec tm;
    tm.tv_sec = 0;
    if (have_futex) {
      tm.tv_nsec = base::internal::SuggestedDelayNS(loop);
    } else {
      tm.tv_nsec = 2000001;   // above 2ms so linux 2.4 doesn't spin
    }
    if (have_futex) {
      tm.tv_nsec *= 16;  // increase the delay; we expect explicit wakeups
      syscall(__NR_futex, reinterpret_cast<int*>(w),
              FUTEX_WAIT | futex_private_flag, value,
              reinterpret_cast<struct kernel_timespec*>(&tm), nullptr, 0);
    } else {
      nanosleep(&tm, nullptr);
    }
    errno = save_errno;
  }
}